

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

void __thiscall
deqp::gls::anon_unknown_1::AttributeArray::data
          (AttributeArray *this,Target target,size_t size,char *ptr,Usage usage)

{
  uint uVar1;
  deUint32 dVar2;
  char *__dest;
  
  this->m_size = (int)size;
  this->m_target = target;
  if (this->m_storage == STORAGE_USER) {
    if (this->m_data != (char *)0x0) {
      operator_delete__(this->m_data);
    }
    __dest = (char *)operator_new__(size);
    this->m_data = __dest;
    memcpy(__dest,ptr,size);
    return;
  }
  if (this->m_storage == STORAGE_BUFFER) {
    uVar1 = ContextArray::targetToGL::targets[(int)target];
    (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,(ulong)uVar1,(ulong)this->m_glBuffer);
    dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar2,"glBindBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x3d3);
    (*this->m_ctx->_vptr_Context[0x28])
              (this->m_ctx,(ulong)uVar1,size,ptr,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                usageToGL(deqp::gls::DrawTestSpec::Usage)::usages +
                               (long)(int)usage * 4));
    dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar2,"glBufferData()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x3d6);
    return;
  }
  return;
}

Assistant:

void AttributeArray::data (DrawTestSpec::Target target, size_t size, const char* ptr, DrawTestSpec::Usage usage)
{
	m_size = (int)size;
	m_target = target;

	if (m_storage == DrawTestSpec::STORAGE_BUFFER)
	{
		m_ctx.bindBuffer(targetToGL(target), m_glBuffer);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

		m_ctx.bufferData(targetToGL(target), size, ptr, usageToGL(usage));
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBufferData()");
	}
	else if (m_storage == DrawTestSpec::STORAGE_USER)
	{
		if (m_data)
			delete[] m_data;

		m_data = new char[size];
		std::memcpy(m_data, ptr, size);
	}
	else
		DE_ASSERT(false);
}